

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O2

uint32_t duckdb::UncompressedStringStorage::GetDictionaryEnd
                   (ColumnSegment *segment,BufferHandle *handle)

{
  data_ptr_t pdVar1;
  
  pdVar1 = BufferHandle::Ptr(handle);
  return *(uint32_t *)(pdVar1 + segment->offset + 4);
}

Assistant:

uint32_t UncompressedStringStorage::GetDictionaryEnd(ColumnSegment &segment, BufferHandle &handle) {
	auto startptr = handle.Ptr() + segment.GetBlockOffset();
	return Load<uint32_t>(startptr + sizeof(uint32_t));
}